

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prs.c
# Opt level: O2

prsndef * prsnew3(prscxdef *ctx,int t,prsndef *n1,prsndef *n2,prsndef *n3)

{
  prsndef *ppVar1;
  
  ppVar1 = (prsndef *)prsbalo(ctx,0x20);
  ppVar1->prsntyp = t;
  ppVar1->prsnnlf = 3;
  (ppVar1->prsnv).prsnvn[0] = n1;
  (ppVar1->prsnv).prsnvn[1] = n2;
  (ppVar1->prsnv).prsnvn[2] = n3;
  return ppVar1;
}

Assistant:

prsndef *prsnew3(prscxdef *ctx, int t, prsndef *n1, prsndef *n2, prsndef *n3)
{
    prsndef *n = prsalo(ctx, 3);
    
    n->prsntyp = t;
    n->prsnnlf = 3;
    n->prsnv.prsnvn[0] = n1;
    n->prsnv.prsnvn[1] = n2;
    n->prsnv.prsnvn[2] = n3;
    return(n);
}